

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::generateIncrementOption
               (double increment,int32_t trailingZeros,UnicodeString *sb,UErrorCode *param_4)

{
  UnicodeString local_c8;
  undefined1 local_78 [8];
  DecimalQuantity dq;
  UErrorCode *param_3_local;
  UnicodeString *sb_local;
  int32_t trailingZeros_local;
  double increment_local;
  
  dq._72_8_ = param_4;
  DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_78);
  DecimalQuantity::setToDouble((DecimalQuantity *)local_78,increment);
  DecimalQuantity::roundToInfinity((DecimalQuantity *)local_78);
  DecimalQuantity::toPlainString(&local_c8,(DecimalQuantity *)local_78);
  UnicodeString::append(sb,&local_c8);
  UnicodeString::~UnicodeString(&local_c8);
  if (0 < trailingZeros) {
    anon_unknown.dwarf_161c80::appendMultiple(sb,0x30,trailingZeros);
  }
  DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_78);
  return;
}

Assistant:

void blueprint_helpers::generateIncrementOption(double increment, int32_t trailingZeros, UnicodeString& sb,
                                                UErrorCode&) {
    // Utilize DecimalQuantity/double_conversion to format this for us.
    DecimalQuantity dq;
    dq.setToDouble(increment);
    dq.roundToInfinity();
    sb.append(dq.toPlainString());

    // We might need to append extra trailing zeros for min fraction...
    if (trailingZeros > 0) {
        appendMultiple(sb, u'0', trailingZeros);
    }
}